

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

TypePointer * __thiscall
TypeFactory::getTypePointerNoDepth(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  int iVar1;
  bool bVar2;
  TypePointer *pTVar3;
  Datatype *pt_00;
  
  pt_00 = pt;
  if (pt->metatype != TYPE_PTR) goto LAB_0027665d;
  iVar1 = *(int *)(pt[1]._vptr_Datatype + 6);
  if (iVar1 == 2) {
LAB_0027664b:
    bVar2 = false;
  }
  else if (iVar1 == 8) {
    if (*(int *)(pt[1]._vptr_Datatype + 1) == pt->size) goto LAB_0027664b;
    pt_00 = getBase(this,pt->size,TYPE_UNKNOWN);
    bVar2 = true;
  }
  else {
    bVar2 = true;
  }
  if (!bVar2) {
    return (TypePointer *)pt;
  }
LAB_0027665d:
  pTVar3 = getTypePointer(this,s,pt_00,ws);
  return pTVar3;
}

Assistant:

TypePointer *TypeFactory::getTypePointerNoDepth(int4 s,Datatype *pt,uint4 ws)

{
  if (pt->getMetatype()==TYPE_PTR) {
    Datatype *basetype = ((TypePointer *)pt)->getPtrTo();
    type_metatype meta = basetype->getMetatype();
    // Make sure that at least we return a pointer to something the size of -pt-
    if (meta == TYPE_PTR)
      return (TypePointer *)pt;
    else if (meta == TYPE_UNKNOWN) {
      if (basetype->getSize() == pt->getSize())	// If -pt- is pointer to UNKNOWN of the size of a pointer
	return (TypePointer *)pt; // Just return pt, don't add another pointer
      pt = getBase(pt->getSize(),TYPE_UNKNOWN);	// Otherwise construct pointer to UNKNOWN of size of pointer
    }
  }
  return getTypePointer(s,pt,ws);
}